

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall
crnlib::dynamic_string::format_args(dynamic_string *this,char *p,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  __gnuc_va_list in_RDX;
  char *in_RSI;
  dynamic_string *in_RDI;
  int l;
  char buf [4096];
  uint cBufSize;
  undefined4 in_stack_ffffffffffffefd0;
  char local_1028 [3];
  undefined1 in_stack_ffffffffffffefdb;
  uint in_stack_ffffffffffffefdc;
  dynamic_string *in_stack_ffffffffffffefe0;
  
  iVar2 = vsnprintf(local_1028,0x1000,in_RSI,in_RDX);
  if (iVar2 < 1) {
    clear((dynamic_string *)CONCAT44(iVar2,in_stack_ffffffffffffefd0));
  }
  else {
    bVar1 = ensure_buf(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc,
                       (bool)in_stack_ffffffffffffefdb);
    if (bVar1) {
      memcpy(in_RDI->m_pStr,local_1028,(long)(iVar2 + 1));
      in_RDI->m_len = (uint16)iVar2;
      check(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

dynamic_string& dynamic_string::format_args(const char* p, va_list args) {
  CRNLIB_ASSERT(p);

  const uint cBufSize = 4096;
  char buf[cBufSize];

#if defined(_WIN32)
  int l = vsnprintf_s(buf, cBufSize, _TRUNCATE, p, args);
#else
  int l = crnlib_vsnprintf(buf, cBufSize, p, args);
#endif
  if (l <= 0)
    clear();
  else if (ensure_buf(l, false)) {
    memcpy(m_pStr, buf, l + 1);

    m_len = static_cast<uint16>(l);

    check();
  }

  return *this;
}